

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O2

void DictionaryStats::ClearStats(void)

{
  DictionaryStats *pDVar1;
  DictionaryType *pDVar2;
  DictionaryStats *obj;
  DictionaryType *type;
  DictionaryType *obj_00;
  
  obj_00 = dictionaryTypes;
  while (obj_00 != (DictionaryType *)0x0) {
    obj = obj_00->instances;
    while (obj != (DictionaryStats *)0x0) {
      pDVar1 = obj->pNext;
      Memory::
      DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,DictionaryStats>
                ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,obj);
      obj = pDVar1;
    }
    pDVar2 = obj_00->pNext;
    Memory::
    DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,DictionaryType>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,obj_00);
    obj_00 = pDVar2;
  }
  dictionaryTypes = (DictionaryType *)0x0;
  return;
}

Assistant:

void DictionaryStats::ClearStats()
{
    // Clear the collection since we already reported on what we already collected
    DictionaryType* current = dictionaryTypes;
    while(current)
    {
        DictionaryType *type = current;
        DictionaryStats *pNext = type->instances;
        while(pNext)
        {
            DictionaryStats *pCurrent = pNext;
            pNext = pNext->pNext;
            NoCheckHeapDelete(pCurrent);
        }
        current = current->pNext;
        NoCheckHeapDelete(type);
    }
    dictionaryTypes = NULL;
}